

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O2

void testExistingStreams(string *tempDir)

{
  float *pfVar1;
  float fVar2;
  Rgba RVar3;
  Rgba *pRVar4;
  undefined8 uVar5;
  _Alloc_hider __filename;
  char cVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  Compression CVar10;
  ostream *poVar11;
  int *piVar12;
  char *pcVar13;
  Box<Imath_3_2::Vec2<int>_> *pBVar14;
  Box<Imath_3_2::Vec2<int>_> *pBVar15;
  undefined1 *puVar16;
  half *phVar17;
  int h;
  int h_00;
  long lVar18;
  long lVar19;
  Compression w;
  int iVar20;
  half *phVar21;
  long lVar22;
  int x;
  int i;
  ulong uVar23;
  int y;
  long lVar24;
  long lVar25;
  RgbaOutputFile out;
  half hStack_36e;
  half hStack_36c;
  half hStack_36a;
  long local_368;
  Rgba *local_360;
  int local_350;
  Array2D<Imf_3_4::Rgba> p1;
  FrameBuffer f;
  Header header;
  half hStack_2f6;
  half hStack_2f4;
  half hStack_2f2;
  ulong local_2f0;
  Rgba *local_2e8;
  ulong *local_2e0;
  ulong *local_2d8;
  ofstream *local_2d0;
  StdOFStream ofs;
  MultiPartOutputFile out_5;
  size_type local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  MultiPartOutputFile out_4;
  long local_258;
  Rgba *local_250;
  int local_248;
  ofstream os;
  char local_230 [8];
  char local_228 [504];
  
  poVar11 = std::operator<<((ostream *)&std::cout,
                            "Testing reading and writing using existing streams");
  std::endl<char,std::char_traits<char>>(poVar11);
  CVar10 = NO_COMPRESSION;
  do {
    if (CVar10 == NUM_COMPRESSION_METHODS) {
      poVar11 = std::operator<<((ostream *)&std::cout,"ok\n");
      std::endl<char,std::char_traits<char>>(poVar11);
      return;
    }
    poVar11 = std::operator<<((ostream *)&std::cout,"compression: ");
    w = CVar10;
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,CVar10);
    std::endl<char,std::char_traits<char>>(poVar11);
    p1._sizeX = 0xed;
    p1._sizeY = 0x77;
    p1._data = (Rgba *)operator_new__(0x37158);
    anon_unknown.dwarf_121b4f::fillPixels1(&p1,w,h);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,tempDir,
                   "imf_test_streams.exr");
    uVar5 = f._map._M_t._M_impl._0_8_;
    poVar11 = std::operator<<((ostream *)&std::cout,"scan-line based file:");
    std::endl<char,std::char_traits<char>>(poVar11);
    std::operator<<((ostream *)&std::cout,"writing");
    remove((char *)uVar5);
    std::ofstream::ofstream(&os);
    std::filebuf::open(local_230,(_Ios_Openmode)uVar5);
    Imf_3_4::StdOFStream::StdOFStream(&ofs,&os,(char *)uVar5);
    _out = 0;
    hStack_36e._h = 0;
    hStack_36c._h = 0;
    hStack_36a._h = 0;
    Imf_3_4::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&out,1.0,INCREASING_Y,CVar10);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaOutputFile::RgbaOutputFile(&out,(OStream *)&ofs,&header,WRITE_RGBA,iVar8);
    Imf_3_4::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
    Imf_3_4::RgbaOutputFile::writePixels((int)(Rgba *)&out);
    Imf_3_4::RgbaOutputFile::~RgbaOutputFile(&out);
    Imf_3_4::Header::~Header(&header);
    Imf_3_4::StdOFStream::~StdOFStream(&ofs);
    std::ofstream::~ofstream(&os);
    std::operator<<((ostream *)&std::cout,", reading");
    std::ifstream::ifstream(&os);
    std::filebuf::open(local_228,(_Ios_Openmode)uVar5);
    Imf_3_4::StdIFStream::StdIFStream((StdIFStream *)&header,(ifstream *)&os,(char *)uVar5);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&header,iVar8);
    piVar12 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar8 = *piVar12;
    lVar18 = (long)piVar12[2] - (long)iVar8;
    iVar9 = piVar12[1];
    lVar24 = (long)piVar12[3] - (long)iVar9;
    Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D((Array2D<Imf_3_4::Rgba> *)&out,lVar24 + 1,lVar18 + 1);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(ulong)(local_360 + (-(long)iVar9 * local_368 - (long)iVar8)),1);
    Imf_3_4::RgbaInputFile::readPixels((int)&ofs,piVar12[1]);
    cVar6 = Imf_3_4::isLossyCompression(CVar10);
    if (cVar6 == '\0') {
      std::operator<<((ostream *)&std::cout,", comparing");
      phVar21 = &(p1._data)->a;
      phVar17 = &local_360->a;
      for (lVar25 = 0; lVar25 <= (int)lVar24; lVar25 = lVar25 + 1) {
        lVar22 = 0;
        while (lVar22 <= (int)lVar18) {
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -3]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22 * 4 + -3]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].r == p1[y][x].r",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x14b,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -2]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22 * 4 + -2]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].g == p1[y][x].g",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x14c,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -1]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22 * 4 + -1]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].b == p1[y][x].b",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x14d,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4]._h * 4);
          lVar19 = lVar22 * 4;
          lVar22 = lVar22 + 1;
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar19]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].a == p1[y][x].a",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x14e,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
        }
        phVar21 = phVar21 + p1._sizeY * 4;
        phVar17 = phVar17 + local_368 * 4;
      }
    }
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&out);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    Imf_3_4::StdIFStream::~StdIFStream((StdIFStream *)&header);
    std::ifstream::~ifstream(&os);
    std::operator<<((ostream *)&std::cout,", reading (memory-mapped)");
    anon_unknown.dwarf_121b4f::MMIFStream::MMIFStream((MMIFStream *)&os,(char *)uVar5);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&os,iVar8);
    piVar12 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar8 = *piVar12;
    lVar18 = (long)piVar12[2] - (long)iVar8;
    iVar9 = piVar12[1];
    lVar24 = (long)piVar12[3] - (long)iVar9;
    Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
              ((Array2D<Imf_3_4::Rgba> *)&header,lVar24 + 1,lVar18 + 1);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(ulong)(local_2e8 + (-(long)iVar9 * local_2f0 - (long)iVar8)),1);
    Imf_3_4::RgbaInputFile::readPixels((int)&ofs,piVar12[1]);
    cVar6 = Imf_3_4::isLossyCompression(CVar10);
    if (cVar6 == '\0') {
      std::operator<<((ostream *)&std::cout,", comparing");
      phVar21 = &(p1._data)->a;
      phVar17 = &local_2e8->a;
      for (lVar25 = 0; lVar25 <= (int)lVar24; lVar25 = lVar25 + 1) {
        lVar22 = 0;
        while (lVar22 <= (int)lVar18) {
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -3]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22 * 4 + -3]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].r == p1[y][x].r",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x16a,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -2]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22 * 4 + -2]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].g == p1[y][x].g",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x16b,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -1]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22 * 4 + -1]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].b == p1[y][x].b",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x16c,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4]._h * 4);
          lVar19 = lVar22 * 4;
          lVar22 = lVar22 + 1;
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar19]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].a == p1[y][x].a",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x16d,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
        }
        phVar21 = phVar21 + p1._sizeY * 4;
        phVar17 = phVar17 + local_2f0 * 4;
      }
    }
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&header);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    anon_unknown.dwarf_121b4f::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::operator<<((ostream *)&std::cout,", reading (memory-mapped, passthru)");
    anon_unknown.dwarf_121b4f::MMIFStream::MMIFStream((MMIFStream *)&os,(char *)uVar5);
    Imf_3_4::IStream::IStream((IStream *)&header,"");
    _header = &PTR__IStream_001ce1c8;
    local_2d0 = &os;
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&header,iVar8);
    piVar12 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar8 = *piVar12;
    lVar18 = (long)piVar12[2] - (long)iVar8;
    iVar9 = piVar12[1];
    lVar24 = (long)piVar12[3] - (long)iVar9;
    Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D((Array2D<Imf_3_4::Rgba> *)&out,lVar24 + 1,lVar18 + 1);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(ulong)(local_360 + (-(long)iVar9 * local_368 - (long)iVar8)),1);
    Imf_3_4::RgbaInputFile::readPixels((int)&ofs,piVar12[1]);
    cVar6 = Imf_3_4::isLossyCompression(CVar10);
    if (cVar6 == '\0') {
      std::operator<<((ostream *)&std::cout,", comparing");
      phVar21 = &(p1._data)->a;
      phVar17 = &local_360->a;
      for (lVar25 = 0; lVar25 <= (int)lVar24; lVar25 = lVar25 + 1) {
        lVar22 = 0;
        while (lVar22 <= (int)lVar18) {
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -3]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22 * 4 + -3]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].r == p1[y][x].r",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x18b,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -2]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22 * 4 + -2]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].g == p1[y][x].g",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x18c,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -1]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22 * 4 + -1]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].b == p1[y][x].b",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x18d,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4]._h * 4);
          lVar19 = lVar22 * 4;
          lVar22 = lVar22 + 1;
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar19]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].a == p1[y][x].a",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x18e,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
        }
        phVar21 = phVar21 + p1._sizeY * 4;
        phVar17 = phVar17 + local_368 * 4;
      }
    }
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&out);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    Imf_3_4::IStream::~IStream((IStream *)&header);
    anon_unknown.dwarf_121b4f::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    remove((char *)uVar5);
    std::__cxx11::string::~string((string *)&f);
    poVar11 = std::operator<<((ostream *)&std::cout,"scan-line based stringstream:");
    std::endl<char,std::char_traits<char>>(poVar11);
    _header = (undefined **)&local_2e8;
    local_2f0 = 0;
    local_2e8 = (Rgba *)((ulong)local_2e8 & 0xffffffffffffff00);
    std::operator<<((ostream *)&std::cout,"writing");
    Imf_3_4::StdOSStream::StdOSStream((StdOSStream *)&os);
    f._map._M_t._M_impl._0_8_ = 0;
    Imf_3_4::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&f,1.0,INCREASING_Y,ZIP_COMPRESSION);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaOutputFile::RgbaOutputFile(&out,(OStream *)&os,(Header *)&ofs,WRITE_RGBA,iVar8);
    Imf_3_4::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
    Imf_3_4::RgbaOutputFile::writePixels((int)(Rgba *)&out);
    Imf_3_4::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&header,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    Imf_3_4::RgbaOutputFile::~RgbaOutputFile(&out);
    Imf_3_4::Header::~Header((Header *)&ofs);
    Imf_3_4::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::operator<<((ostream *)&std::cout,", reading");
    Imf_3_4::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_4::StdISStream::clear();
    Imf_3_4::StdISStream::str((string *)&os);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&os,iVar8);
    piVar12 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar8 = *piVar12;
    lVar18 = (long)piVar12[2] - (long)iVar8;
    iVar9 = piVar12[1];
    lVar25 = (long)piVar12[3] - (long)iVar9;
    Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D((Array2D<Imf_3_4::Rgba> *)&f,lVar25 + 1,lVar18 + 1);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,
               (long)f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
               (long)iVar8 * -8 +
               -(long)iVar9 * f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ * 8,1);
    Imf_3_4::RgbaInputFile::readPixels((int)&ofs,piVar12[1]);
    std::operator<<((ostream *)&std::cout,", comparing");
    phVar17 = &(p1._data)->a;
    puVar16 = &(f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->field_0x6;
    for (lVar24 = 0; lVar24 <= (int)lVar25; lVar24 = lVar24 + 1) {
      lVar22 = 0;
      while (lVar22 <= (int)lVar18) {
        fVar2 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(puVar16 + lVar22 * 8 + -6) * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -3]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].r == p1[y][x].r",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x322,
                        "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                       );
        }
        fVar2 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(puVar16 + lVar22 * 8 + -4) * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -2]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].g == p1[y][x].g",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x323,
                        "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                       );
        }
        fVar2 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(puVar16 + lVar22 * 8 + -2) * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -1]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].b == p1[y][x].b",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x324,
                        "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                       );
        }
        fVar2 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(puVar16 + lVar22 * 8) * 4
                          );
        lVar19 = lVar22 * 4;
        lVar22 = lVar22 + 1;
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar17[lVar19]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].a == p1[y][x].a",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x325,
                        "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                       );
        }
      }
      phVar17 = phVar17 + p1._sizeY * 4;
      puVar16 = puVar16 + f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ * 8;
    }
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&f);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    Imf_3_4::StdISStream::~StdISStream((StdISStream *)&os);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__cxx11::string::~string((string *)&header);
    lVar18 = 0;
    for (lVar24 = 0; lVar24 != 0xed; lVar24 = lVar24 + 1) {
      lVar25 = 6;
      for (lVar22 = 0; pRVar4 = p1._data, lVar22 != 0x77; lVar22 = lVar22 + 1) {
        lVar19 = p1._sizeY * lVar18;
        phVar17 = &(p1._data)->r;
        Imath_3_2::half::operator=
                  ((half *)((long)p1._data + lVar25 + lVar19 + -6),(float)((uint)lVar22 & 2));
        Imath_3_2::half::operator=
                  ((half *)((long)pRVar4 + lVar25 + lVar19 + -4),
                   (float)((uint)lVar24 + (uint)lVar22 & 2));
        Imath_3_2::half::operator=
                  ((half *)((long)pRVar4 + lVar25 + lVar19 + -2),(float)((uint)lVar24 & 2));
        Imath_3_2::half::operator=
                  ((half *)((long)&phVar17->_h + lVar25 + lVar19),
                   (*(float *)(_imath_half_to_float_table +
                              (ulong)*(uint16_t *)((long)&pRVar4[lVar22].r._h + lVar19) * 4) +
                    *(float *)(_imath_half_to_float_table +
                              (ulong)*(uint16_t *)((long)&pRVar4[lVar22].b._h + lVar19) * 4) +
                   *(float *)(_imath_half_to_float_table +
                             (ulong)*(uint16_t *)((long)&pRVar4[lVar22].g._h + lVar19) * 4)) / 3.0);
        lVar25 = lVar25 + 8;
      }
      lVar18 = lVar18 + 8;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,tempDir,
                   "imf_test_streams2.exr");
    uVar5 = f._map._M_t._M_impl._0_8_;
    poVar11 = std::operator<<((ostream *)&std::cout,"tiled file:");
    std::endl<char,std::char_traits<char>>(poVar11);
    std::operator<<((ostream *)&std::cout,"writing");
    remove((char *)uVar5);
    std::ofstream::ofstream(&os);
    std::filebuf::open(local_230,(_Ios_Openmode)uVar5);
    Imf_3_4::StdOFStream::StdOFStream(&ofs,&os,(char *)uVar5);
    _out = 0;
    hStack_36e._h = 0;
    hStack_36c._h = 0;
    hStack_36a._h = 0;
    Imf_3_4::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&out,1.0,INCREASING_Y,CVar10);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
              ((TiledRgbaOutputFile *)&out,(OStream *)&ofs,&header,WRITE_RGBA,0x14,0x14,ONE_LEVEL,
               ROUND_DOWN,iVar8);
    Imf_3_4::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
    iVar20 = (int)(Rgba *)&out;
    iVar8 = Imf_3_4::TiledRgbaOutputFile::numXTiles(iVar20);
    iVar9 = Imf_3_4::TiledRgbaOutputFile::numYTiles(iVar20);
    Imf_3_4::TiledRgbaOutputFile::writeTiles(iVar20,0,iVar8 + -1,0,iVar9 + -1);
    Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
    Imf_3_4::Header::~Header(&header);
    Imf_3_4::StdOFStream::~StdOFStream(&ofs);
    std::ofstream::~ofstream(&os);
    std::operator<<((ostream *)&std::cout,", reading");
    std::ifstream::ifstream(&os);
    std::filebuf::open(local_228,(_Ios_Openmode)uVar5);
    Imf_3_4::StdIFStream::StdIFStream((StdIFStream *)&ofs,(ifstream *)&os,(char *)uVar5);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
              ((TiledRgbaInputFile *)&header,(IStream *)&ofs,iVar8);
    piVar12 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
    iVar8 = *piVar12;
    lVar18 = (long)piVar12[2] - (long)iVar8;
    iVar9 = piVar12[1];
    lVar24 = (long)piVar12[3] - (long)iVar9;
    Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D((Array2D<Imf_3_4::Rgba> *)&out,lVar24 + 1,lVar18 + 1);
    Imf_3_4::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&header,(ulong)(local_360 + (-(long)iVar9 * local_368 - (long)iVar8)),1);
    iVar20 = (int)(Rgba *)&header;
    iVar8 = Imf_3_4::TiledRgbaInputFile::numXTiles(iVar20);
    iVar9 = Imf_3_4::TiledRgbaInputFile::numYTiles(iVar20);
    Imf_3_4::TiledRgbaInputFile::readTiles(iVar20,0,iVar8 + -1,0,iVar9 + -1);
    cVar6 = Imf_3_4::isLossyCompression(CVar10);
    if (cVar6 == '\0') {
      std::operator<<((ostream *)&std::cout,", comparing");
      phVar21 = &(p1._data)->a;
      phVar17 = &local_360->a;
      for (lVar25 = 0; lVar25 <= (int)lVar24; lVar25 = lVar25 + 1) {
        lVar22 = 0;
        while (lVar22 <= (int)lVar18) {
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -3]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22 * 4 + -3]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].r == p1[y][x].r",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x2c2,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -2]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22 * 4 + -2]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].g == p1[y][x].g",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x2c3,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -1]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22 * 4 + -1]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].b == p1[y][x].b",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x2c4,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4]._h * 4);
          lVar19 = lVar22 * 4;
          lVar22 = lVar22 + 1;
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar19]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].a == p1[y][x].a",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x2c5,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
        }
        phVar21 = phVar21 + p1._sizeY * 4;
        phVar17 = phVar17 + local_368 * 4;
      }
    }
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&out);
    Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    Imf_3_4::StdIFStream::~StdIFStream((StdIFStream *)&ofs);
    std::ifstream::~ifstream(&os);
    std::operator<<((ostream *)&std::cout,", reading (memory-mapped)");
    anon_unknown.dwarf_121b4f::MMIFStream::MMIFStream((MMIFStream *)&os,(char *)uVar5);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&ofs,(IStream *)&os,iVar8)
    ;
    piVar12 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
    iVar8 = *piVar12;
    lVar18 = (long)piVar12[2] - (long)iVar8;
    iVar9 = piVar12[1];
    lVar24 = (long)piVar12[3] - (long)iVar9;
    Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
              ((Array2D<Imf_3_4::Rgba> *)&header,lVar24 + 1,lVar18 + 1);
    Imf_3_4::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(ulong)(local_2e8 + (-(long)iVar9 * local_2f0 - (long)iVar8)),1);
    iVar8 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&ofs);
    iVar9 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&ofs);
    Imf_3_4::TiledRgbaInputFile::readTiles((int)&ofs,0,iVar8 + -1,0,iVar9 + -1);
    cVar6 = Imf_3_4::isLossyCompression(CVar10);
    if (cVar6 == '\0') {
      std::operator<<((ostream *)&std::cout,", comparing");
      phVar21 = &(p1._data)->a;
      phVar17 = &local_2e8->a;
      for (lVar25 = 0; lVar25 <= (int)lVar24; lVar25 = lVar25 + 1) {
        lVar22 = 0;
        while (lVar22 <= (int)lVar18) {
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -3]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22 * 4 + -3]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].r == p1[y][x].r",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x2e1,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -2]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22 * 4 + -2]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].g == p1[y][x].g",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x2e2,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -1]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22 * 4 + -1]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].b == p1[y][x].b",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x2e3,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4]._h * 4);
          lVar19 = lVar22 * 4;
          lVar22 = lVar22 + 1;
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar19]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].a == p1[y][x].a",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x2e4,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
        }
        phVar21 = phVar21 + p1._sizeY * 4;
        phVar17 = phVar17 + local_2f0 * 4;
      }
    }
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&header);
    Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&ofs);
    anon_unknown.dwarf_121b4f::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    remove((char *)uVar5);
    std::__cxx11::string::~string((string *)&f);
    poVar11 = std::operator<<((ostream *)&std::cout,"tiled stringstream:");
    std::endl<char,std::char_traits<char>>(poVar11);
    _header = (undefined **)&local_2e8;
    local_2f0 = 0;
    local_2e8 = (Rgba *)((ulong)local_2e8 & 0xffffffffffffff00);
    std::operator<<((ostream *)&std::cout,"writing");
    Imf_3_4::StdOSStream::StdOSStream((StdOSStream *)&os);
    f._map._M_t._M_impl._0_8_ = 0;
    Imf_3_4::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&f,1.0,INCREASING_Y,ZIP_COMPRESSION);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
              ((TiledRgbaOutputFile *)&out,(OStream *)&os,(Header *)&ofs,WRITE_RGBA,0x14,0x14,
               ONE_LEVEL,ROUND_DOWN,iVar8);
    Imf_3_4::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
    iVar20 = (int)(Rgba *)&out;
    iVar8 = Imf_3_4::TiledRgbaOutputFile::numXTiles(iVar20);
    iVar9 = Imf_3_4::TiledRgbaOutputFile::numYTiles(iVar20);
    Imf_3_4::TiledRgbaOutputFile::writeTiles(iVar20,0,iVar8 + -1,0,iVar9 + -1);
    Imf_3_4::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&header,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
    Imf_3_4::Header::~Header((Header *)&ofs);
    Imf_3_4::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::operator<<((ostream *)&std::cout,", reading");
    Imf_3_4::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_4::StdISStream::clear();
    Imf_3_4::StdISStream::str((string *)&os);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&ofs,(IStream *)&os,iVar8)
    ;
    piVar12 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
    iVar8 = *piVar12;
    lVar18 = (long)piVar12[2] - (long)iVar8;
    iVar9 = piVar12[1];
    lVar25 = (long)piVar12[3] - (long)iVar9;
    Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D((Array2D<Imf_3_4::Rgba> *)&f,lVar25 + 1,lVar18 + 1);
    Imf_3_4::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,
               (long)f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
               (long)iVar8 * -8 +
               -(long)iVar9 * f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ * 8,1);
    iVar20 = (int)(Rgba *)&ofs;
    iVar8 = Imf_3_4::TiledRgbaInputFile::numXTiles(iVar20);
    iVar9 = Imf_3_4::TiledRgbaInputFile::numYTiles(iVar20);
    Imf_3_4::TiledRgbaInputFile::readTiles(iVar20,0,iVar8 + -1,0,iVar9 + -1);
    std::operator<<((ostream *)&std::cout,", comparing");
    phVar17 = &(p1._data)->a;
    iVar8 = (int)p1._sizeY * 8;
    puVar16 = &(f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->field_0x6;
    for (lVar24 = 0; lVar24 <= (int)lVar25; lVar24 = lVar24 + 1) {
      lVar22 = 0;
      while (lVar22 <= (int)lVar18) {
        fVar2 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(puVar16 + lVar22 * 8 + -6) * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -3]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].r == p1[y][x].r",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x3f3,
                        "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                       );
        }
        fVar2 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(puVar16 + lVar22 * 8 + -4) * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -2]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].g == p1[y][x].g",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x3f4,
                        "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                       );
        }
        fVar2 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(puVar16 + lVar22 * 8 + -2) * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -1]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].b == p1[y][x].b",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x3f5,
                        "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                       );
        }
        fVar2 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(puVar16 + lVar22 * 8) * 4
                          );
        lVar19 = lVar22 * 4;
        lVar22 = lVar22 + 1;
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar17[lVar19]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].a == p1[y][x].a",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x3f6,
                        "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                       );
        }
      }
      phVar17 = phVar17 + p1._sizeY * 4;
      puVar16 = puVar16 + f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ * 8;
    }
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&f);
    Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&ofs);
    Imf_3_4::StdISStream::~StdISStream((StdISStream *)&os);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__cxx11::string::~string((string *)&header);
    anon_unknown.dwarf_121b4f::fillPixels1(&p1,iVar8,h_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out_5,
                   tempDir,"imf_test_streams3.exr");
    __filename._M_p = _out_5;
    poVar11 = std::operator<<((ostream *)&std::cout,"scan-line based multipart file:");
    std::endl<char,std::char_traits<char>>(poVar11);
    std::operator<<((ostream *)&std::cout,"writing");
    remove(__filename._M_p);
    std::ofstream::ofstream(&os);
    std::filebuf::open(local_230,(_Ios_Openmode)__filename._M_p);
    Imf_3_4::StdOFStream::StdOFStream(&ofs,&os,__filename._M_p);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&out,2,
               (allocator_type *)&header);
    f._map._M_t._M_impl._0_8_ = 0;
    Imf_3_4::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&f,1.0,INCREASING_Y,CVar10);
    Imf_3_4::Header::operator=((Header *)_out,&header);
    Imf_3_4::Header::~Header(&header);
    RVar3 = _out;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&header,"part1",(allocator<char> *)&f);
    Imf_3_4::Header::setName((string *)RVar3);
    std::__cxx11::string::~string((string *)&header);
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1997db);
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1997ee);
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x199801);
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a2eb5);
    Imf_3_4::Header::setType((string *)_out);
    Imf_3_4::Header::operator=((Header *)((long)_out + 0x38),(Header *)_out);
    RVar3 = _out;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&header,"part2",(allocator<char> *)&f);
    Imf_3_4::Header::setName((string *)((long)RVar3 + 0x38));
    std::__cxx11::string::~string((string *)&header);
    RVar3 = _out;
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
              (&out_4,(OStream *)&ofs,(Header *)RVar3,2,false,iVar8);
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &f._map._M_t._M_impl.super__Rb_tree_header._M_header;
    f._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_4::Slice::Slice((Slice *)&header,HALF,(char *)p1._data,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&f,(Slice *)0x1997db);
    Imf_3_4::Slice::Slice((Slice *)&header,HALF,(char *)&(p1._data)->g,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&f,(Slice *)0x1997ee);
    Imf_3_4::Slice::Slice((Slice *)&header,HALF,(char *)&(p1._data)->b,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&f,(Slice *)0x199801);
    Imf_3_4::Slice::Slice((Slice *)&header,HALF,(char *)&(p1._data)->a,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&f,(Slice *)0x1a2eb5);
    for (iVar8 = 0; iVar9 = (int)(Array2D<Imf_3_4::Rgba> *)&header, iVar8 != 2; iVar8 = iVar8 + 1) {
      Imf_3_4::OutputPart::OutputPart((OutputPart *)&header,&out_4,iVar8);
      Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)&header);
      Imf_3_4::OutputPart::writePixels(iVar9);
    }
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&f);
    Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&out_4);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&out);
    Imf_3_4::StdOFStream::~StdOFStream(&ofs);
    std::ofstream::~ofstream(&os);
    std::operator<<((ostream *)&std::cout,", reading");
    std::ifstream::ifstream(&os);
    std::filebuf::open(local_228,(_Ios_Openmode)__filename._M_p);
    Imf_3_4::StdIFStream::StdIFStream((StdIFStream *)&ofs,(ifstream *)&os,__filename._M_p);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&out,(IStream *)&ofs,iVar8,true);
    iVar8 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar8 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x1f8,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&out);
    pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
    Imf_3_4::MultiPartInputFile::header((int)&out);
    pBVar15 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
    bVar7 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar14,pBVar15);
    if (!bVar7) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x1fa,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&out);
    piVar12 = (int *)Imf_3_4::Header::dataWindow();
    iVar8 = piVar12[2];
    lVar22 = (long)*piVar12;
    lVar18 = (iVar8 - lVar22) + 1;
    iVar20 = piVar12[1];
    lVar24 = (long)piVar12[3] - (long)iVar20;
    Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D((Array2D<Imf_3_4::Rgba> *)&out_4,lVar24 + 1,lVar18);
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &f._map._M_t._M_impl.super__Rb_tree_header._M_header;
    f._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar25 = -(long)iVar20;
    uVar23 = lVar18 * 8;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_4::Slice::Slice
              ((Slice *)&header,HALF,(char *)(local_250 + (local_258 * lVar25 - lVar22)),8,uVar23,1,
               1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&f,(Slice *)0x1997db);
    Imf_3_4::Slice::Slice
              ((Slice *)&header,HALF,(char *)&local_250[local_258 * lVar25 - lVar22].g,8,uVar23,1,1,
               0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&f,(Slice *)0x1997ee);
    Imf_3_4::Slice::Slice
              ((Slice *)&header,HALF,(char *)&local_250[local_258 * lVar25 - lVar22].b,8,uVar23,1,1,
               0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&f,(Slice *)0x199801);
    Imf_3_4::Slice::Slice
              ((Slice *)&header,HALF,(char *)&local_250[lVar25 * local_258 - lVar22].a,8,uVar23,1,1,
               0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&f,(Slice *)0x1a2eb5);
    local_248 = (int)(iVar8 - lVar22);
    for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
      Imf_3_4::InputPart::InputPart((InputPart *)&header,(MultiPartInputFile *)&out,iVar8);
      Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&header);
      Imf_3_4::InputPart::readPixels(iVar9,piVar12[1]);
      cVar6 = Imf_3_4::isLossyCompression(CVar10);
      if (cVar6 == '\0') {
        poVar11 = std::operator<<((ostream *)&std::cout,", comparing pt ");
        std::ostream::operator<<(poVar11,iVar8);
        phVar21 = &(p1._data)->a;
        phVar17 = &local_250->a;
        for (lVar18 = 0; lVar18 <= (int)lVar24; lVar18 = lVar18 + 1) {
          lVar25 = 0;
          while (lVar25 <= local_248) {
            fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar25 * 4 + -3]._h * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar25 * 4 + -3]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x22e,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar25 * 4 + -2]._h * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar25 * 4 + -2]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x22f,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar25 * 4 + -1]._h * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar25 * 4 + -1]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x230,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar25 * 4]._h * 4);
            lVar22 = lVar25 * 4;
            lVar25 = lVar25 + 1;
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x231,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
          }
          phVar21 = phVar21 + p1._sizeY * 4;
          phVar17 = phVar17 + local_258 * 4;
        }
      }
    }
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&f);
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&out_4);
    Imf_3_4::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&out);
    Imf_3_4::StdIFStream::~StdIFStream((StdIFStream *)&ofs);
    std::ifstream::~ifstream(&os);
    std::operator<<((ostream *)&std::cout,", reading (memory-mapped)");
    anon_unknown.dwarf_121b4f::MMIFStream::MMIFStream((MMIFStream *)&os,__filename._M_p);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&f,(IStream *)&os,iVar8,true);
    iVar8 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar8 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x23d,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&f);
    pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
    Imf_3_4::MultiPartInputFile::header((int)&f);
    pBVar15 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
    bVar7 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar14,pBVar15);
    if (!bVar7) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x23f,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&f);
    piVar12 = (int *)Imf_3_4::Header::dataWindow();
    iVar8 = piVar12[2];
    lVar22 = (long)*piVar12;
    lVar18 = (iVar8 - lVar22) + 1;
    iVar9 = piVar12[1];
    lVar24 = (long)piVar12[3] - (long)iVar9;
    Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D((Array2D<Imf_3_4::Rgba> *)&out,lVar24 + 1,lVar18);
    local_2f0 = local_2f0 & 0xffffffff00000000;
    local_2e8 = (Rgba *)0x0;
    local_2e0 = &local_2f0;
    local_2d0 = (ofstream *)0x0;
    lVar25 = -(long)iVar9;
    uVar23 = lVar18 * 8;
    local_2d8 = local_2e0;
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)(local_360 + (local_368 * lVar25 - lVar22)),8,uVar23,1,1,
               0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1997db);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)&local_360[local_368 * lVar25 - lVar22].g,8,uVar23,1,1,0.0
               ,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1997ee);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)&local_360[local_368 * lVar25 - lVar22].b,8,uVar23,1,1,0.0
               ,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x199801);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)&local_360[lVar25 * local_368 - lVar22].a,8,uVar23,1,1,0.0
               ,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1a2eb5);
    local_248 = (int)(iVar8 - lVar22);
    for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
      Imf_3_4::InputPart::InputPart((InputPart *)&ofs,(MultiPartInputFile *)&f,iVar8);
      Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_4::InputPart::readPixels((int)&ofs,piVar12[1]);
      cVar6 = Imf_3_4::isLossyCompression(CVar10);
      if (cVar6 == '\0') {
        poVar11 = std::operator<<((ostream *)&std::cout,", comparing pt ");
        std::ostream::operator<<(poVar11,iVar8);
        phVar21 = &(p1._data)->a;
        phVar17 = &local_360->a;
        for (lVar18 = 0; lVar18 <= (int)lVar24; lVar18 = lVar18 + 1) {
          lVar25 = 0;
          while (lVar25 <= local_248) {
            fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar25 * 4 + -3]._h * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar25 * 4 + -3]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x273,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar25 * 4 + -2]._h * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar25 * 4 + -2]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x274,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar25 * 4 + -1]._h * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar25 * 4 + -1]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x275,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar17[lVar25 * 4]._h * 4);
            lVar22 = lVar25 * 4;
            lVar25 = lVar25 + 1;
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar21[lVar22]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x276,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
          }
          phVar21 = phVar21 + p1._sizeY * 4;
          phVar17 = phVar17 + local_368 * 4;
        }
      }
    }
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&header);
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&out);
    Imf_3_4::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&f);
    anon_unknown.dwarf_121b4f::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    remove(__filename._M_p);
    std::__cxx11::string::~string((string *)&out_5);
    poVar11 = std::operator<<((ostream *)&std::cout,"scan-line based multipart stringstream:");
    std::endl<char,std::char_traits<char>>(poVar11);
    f._map._M_t._M_impl._0_8_ = &f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00)
    ;
    std::operator<<((ostream *)&std::cout,"writing");
    Imf_3_4::StdOSStream::StdOSStream((StdOSStream *)&os);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&out,2,
               (allocator_type *)&ofs);
    _header = 0;
    hStack_2f6._h = 0;
    hStack_2f4._h = 0;
    hStack_2f2._h = 0;
    Imf_3_4::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&header,1.0,INCREASING_Y,ZIP_COMPRESSION);
    Imf_3_4::Header::operator=((Header *)_out,(Header *)&ofs);
    Imf_3_4::Header::~Header((Header *)&ofs);
    RVar3 = _out;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,"part1",(allocator<char> *)&header);
    Imf_3_4::Header::setName((string *)RVar3);
    std::__cxx11::string::~string((string *)&ofs);
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1997db);
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1997ee);
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x199801);
    pcVar13 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar13,(Channel *)0x1a2eb5);
    Imf_3_4::Header::setType((string *)_out);
    Imf_3_4::Header::operator=((Header *)((long)_out + 0x38),(Header *)_out);
    RVar3 = _out;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,"part2",(allocator<char> *)&header);
    Imf_3_4::Header::setName((string *)((long)RVar3 + 0x38));
    std::__cxx11::string::~string((string *)&ofs);
    RVar3 = _out;
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
              (&out_5,(OStream *)&os,(Header *)RVar3,2,false,iVar8);
    local_2f0 = local_2f0 & 0xffffffff00000000;
    local_2e8 = (Rgba *)0x0;
    local_2e0 = &local_2f0;
    local_2d0 = (ofstream *)0x0;
    local_2d8 = local_2e0;
    Imf_3_4::Slice::Slice((Slice *)&ofs,HALF,(char *)p1._data,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1997db);
    Imf_3_4::Slice::Slice((Slice *)&ofs,HALF,(char *)&(p1._data)->g,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1997ee);
    Imf_3_4::Slice::Slice((Slice *)&ofs,HALF,(char *)&(p1._data)->b,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x199801);
    Imf_3_4::Slice::Slice((Slice *)&ofs,HALF,(char *)&(p1._data)->a,8,0x3b8,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1a2eb5);
    for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
      Imf_3_4::OutputPart::OutputPart((OutputPart *)&ofs,&out_5,iVar8);
      Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_4::OutputPart::writePixels((int)(OutputPart *)&ofs);
    }
    Imf_3_4::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&f,(string *)&ofs);
    std::__cxx11::string::~string((string *)&ofs);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&header);
    Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&out_5);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&out);
    Imf_3_4::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::operator<<((ostream *)&std::cout,", reading");
    Imf_3_4::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_4::StdISStream::clear();
    Imf_3_4::StdISStream::str((string *)&os);
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&out,(IStream *)&os,iVar8,true);
    iVar8 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar8 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x380,
                    "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&out);
    pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
    Imf_3_4::MultiPartInputFile::header((int)&out);
    pBVar15 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
    bVar7 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar14,pBVar15);
    if (!bVar7) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x382,
                    "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_4::MultiPartInputFile::header((int)&out);
    piVar12 = (int *)Imf_3_4::Header::dataWindow();
    iVar8 = piVar12[2];
    lVar22 = (long)*piVar12;
    lVar18 = (iVar8 - lVar22) + 1;
    iVar9 = piVar12[1];
    lVar24 = (long)piVar12[3] - (long)iVar9;
    Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D((Array2D<Imf_3_4::Rgba> *)&out_5,lVar24 + 1,lVar18);
    local_2f0 = local_2f0 & 0xffffffff00000000;
    local_2e8 = (Rgba *)0x0;
    local_2e0 = &local_2f0;
    local_2d0 = (ofstream *)0x0;
    lVar25 = -(long)iVar9;
    uVar23 = lVar18 * 8;
    local_2d8 = local_2e0;
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,
               (char *)(local_278 * lVar25 * 8 + local_270._M_allocated_capacity + lVar22 * -8),8,
               uVar23,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1997db);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,
               (char *)(local_278 * lVar25 * 8 + local_270._M_allocated_capacity + lVar22 * -8 + 2),
               8,uVar23,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1997ee);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,
               (char *)(local_278 * lVar25 * 8 + local_270._M_allocated_capacity + lVar22 * -8 + 4),
               8,uVar23,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x199801);
    Imf_3_4::Slice::Slice
              ((Slice *)&ofs,HALF,
               (char *)(lVar22 * -8 + 6 + lVar25 * local_278 * 8 + local_270._M_allocated_capacity),
               8,uVar23,1,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&header,(Slice *)0x1a2eb5);
    local_350 = (int)(iVar8 - lVar22);
    for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
      Imf_3_4::InputPart::InputPart((InputPart *)&ofs,(MultiPartInputFile *)&out,iVar8);
      Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_4::InputPart::readPixels((int)&ofs,piVar12[1]);
      poVar11 = std::operator<<((ostream *)&std::cout,", comparing pt ");
      std::ostream::operator<<(poVar11,iVar8);
      phVar17 = &(p1._data)->a;
      lVar18 = local_270._M_allocated_capacity + 6;
      for (lVar25 = 0; lVar25 <= (int)lVar24; lVar25 = lVar25 + 1) {
        lVar22 = 0;
        while (lVar22 <= local_350) {
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar18 + -6 + lVar22 * 8) * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -3]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].r == p1[y][x].r",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x3b4,
                          "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar18 + -4 + lVar22 * 8) * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -2]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].g == p1[y][x].g",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x3b5,
                          "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar18 + -2 + lVar22 * 8) * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar17[lVar22 * 4 + -1]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].b == p1[y][x].b",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x3b6,
                          "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar18 + lVar22 * 8) * 4);
          lVar19 = lVar22 * 4;
          lVar22 = lVar22 + 1;
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar17[lVar19]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].a == p1[y][x].a",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x3b7,
                          "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                         );
          }
        }
        phVar17 = phVar17 + p1._sizeY * 4;
        lVar18 = lVar18 + local_278 * 8;
      }
    }
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&header);
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&out_5);
    Imf_3_4::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&out);
    Imf_3_4::StdISStream::~StdISStream((StdISStream *)&os);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__cxx11::string::~string((string *)&f);
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&p1);
    CVar10 = CVar10 + RLE_COMPRESSION;
  } while( true );
}

Assistant:

void
testExistingStreams (const std::string& tempDir)
{
    try
    {
        cout << "Testing reading and writing using existing streams" << endl;

        const int W = 119;
        const int H = 237;

        for (int compression = 0; compression < NUM_COMPRESSION_METHODS;
             ++compression)
        {
            cout << "compression: " << compression << endl;

            Array2D<Rgba> p1 (H, W);

            fillPixels1 (p1, W, H);
            writeReadScanLines (
                (tempDir + "imf_test_streams.exr").c_str (),
                W,
                H,
                static_cast<Compression> (compression),
                p1);
            writeReadScanLines (W, H, p1);

            fillPixels2 (p1, W, H);
            writeReadTiles (
                (tempDir + "imf_test_streams2.exr").c_str (),
                W,
                H,
                static_cast<Compression> (compression),
                p1);
            writeReadTiles (W, H, p1);

            fillPixels1 (p1, W, H);
            writeReadMultiPart (
                (tempDir + "imf_test_streams3.exr").c_str (),
                W,
                H,
                static_cast<Compression> (compression),
                p1);
            writeReadMultiPart (W, H, p1);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}